

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.h
# Opt level: O3

void __thiscall FIX::Exception::~Exception(Exception *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  *(undefined ***)this = &PTR__Exception_0011c3e0;
  pcVar2 = (this->detail)._M_dataplus._M_p;
  paVar1 = &(this->detail).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->type)._M_dataplus._M_p;
  paVar1 = &(this->type).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::logic_error::~logic_error(&this->super_logic_error);
  return;
}

Assistant:

~Exception() NOEXCEPT {}